

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

int OPENSSL_strcasecmp(char *a,char *b)

{
  int iVar1;
  int iVar2;
  int bb;
  int aa;
  size_t i;
  char *b_local;
  char *a_local;
  
  _bb = 0;
  while( true ) {
    iVar1 = OPENSSL_tolower((int)a[_bb]);
    iVar2 = OPENSSL_tolower((int)b[_bb]);
    if (iVar1 < iVar2) {
      return -1;
    }
    if (iVar2 < iVar1) break;
    if (iVar1 == 0) {
      return 0;
    }
    _bb = _bb + 1;
  }
  return 1;
}

Assistant:

int OPENSSL_strcasecmp(const char *a, const char *b) {
  for (size_t i = 0;; i++) {
    const int aa = OPENSSL_tolower(a[i]);
    const int bb = OPENSSL_tolower(b[i]);

    if (aa < bb) {
      return -1;
    } else if (aa > bb) {
      return 1;
    } else if (aa == 0) {
      return 0;
    }
  }
}